

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

Clause * __thiscall LinearGE<0,_1>::explain(LinearGE<0,_1> *this,Lit param_1,int inf_id)

{
  uint uVar1;
  uint uVar2;
  Lit *pLVar3;
  Lit LVar4;
  int iVar5;
  Clause *pCVar6;
  long lVar7;
  uint i;
  ulong uVar8;
  
  uVar1 = (this->x).sz;
  uVar2 = (this->y).sz;
  if (sat.assigns.data[(uint)(this->r).v] != '\0') {
    LVar4 = BoolView::getValLit(&this->r);
    ((this->ps).data)->x = LVar4.x;
  }
  lVar7 = 0;
  for (uVar8 = 0; uVar8 < (this->x).sz; uVar8 = uVar8 + 1) {
    iVar5 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar7) + 0x48))();
    (this->ps).data[uVar8 + 1].x = iVar5;
    lVar7 = lVar7 + 0x10;
  }
  lVar7 = 0;
  for (uVar8 = 0; uVar8 < (this->y).sz; uVar8 = uVar8 + 1) {
    iVar5 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar7) + 0x40))();
    (this->ps).data[(this->x).sz + (int)uVar8 + 1].x = iVar5;
    lVar7 = lVar7 + 0x10;
  }
  uVar8 = 0;
  if (uVar2 + uVar1 != inf_id) {
    uVar8 = (ulong)(inf_id + 1);
  }
  pLVar3 = (this->ps).data;
  pLVar3[uVar8].x = pLVar3->x;
  pCVar6 = Reason_new<vec<Lit>>(&this->ps);
  return pCVar6;
}

Assistant:

Clause* explain(Lit /*p*/, int inf_id) override {
		if (inf_id == static_cast<int>(x.size() + y.size())) {
			inf_id = -1;
		}
		if ((R != 0) && r.isFixed()) {
			ps[0] = r.getValLit();
		}
		for (unsigned int i = 0; i < x.size(); i++) {
			ps[i + R] = x[i].getMaxLit();
		}
		for (unsigned int i = 0; i < y.size(); i++) {
			ps[i + R + x.size()] = y[i].getMaxLit();
		}
		ps[R + inf_id] = ps[0];
		return Reason_new(ps);
	}